

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::ContainerPrinter::
     PrintValue<std::vector<bfy_iovec,std::allocator<bfy_iovec>>,void>
               (vector<bfy_iovec,_std::allocator<bfy_iovec>_> *container,ostream *os)

{
  pointer pbVar1;
  long lVar2;
  pointer io;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_33,1);
  io = (container->super__Vector_base<bfy_iovec,_std::allocator<bfy_iovec>_>)._M_impl.
       super__Vector_impl_data._M_start;
  pbVar1 = (container->super__Vector_base<bfy_iovec,_std::allocator<bfy_iovec>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (io != pbVar1) {
    lVar2 = 0;
    do {
      if ((lVar2 != 0) &&
         (std::__ostream_insert<char,std::char_traits<char>>(os,&local_35,1), lVar2 == 0x20)) {
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        goto LAB_00130e7d;
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_34,1);
      ::operator<<(os,io);
      lVar2 = lVar2 + 1;
      io = io + 1;
    } while (io != pbVar1);
    if (lVar2 != 0) {
LAB_00130e7d:
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }